

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O2

int Abc_FileSize(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    iVar1 = -1;
  }
  else {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    iVar1 = (int)lVar2;
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int Abc_FileSize( char * pFileName )
{
    FILE * pFile;
    int nFileSize;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return -1;
    }
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    fclose( pFile );
    return nFileSize;
}